

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O2

void __thiscall
GdlBinaryExpression::GdlBinaryExpression
          (GdlBinaryExpression *this,Symbol psymOperator,GdlExpression *pexpOp1,
          GdlExpression *pexpOp2)

{
  GdlExpression::GdlExpression(&this->super_GdlExpression);
  (this->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_00212430;
  this->m_psymOperator = psymOperator;
  this->m_pexpOperand1 = pexpOp1;
  this->m_pexpOperand2 = pexpOp2;
  if ((pexpOp1 != (GdlExpression *)0x0) && ((pexpOp1->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pexpOp1->_vptr_GdlExpression[4])(pexpOp1,&(this->super_GdlExpression).super_GdlObject);
    pexpOp2 = this->m_pexpOperand2;
  }
  if ((pexpOp2 != (GdlExpression *)0x0) && ((pexpOp2->super_GdlObject).m_lnf.m_nLinePre == 0)) {
    (*pexpOp2->_vptr_GdlExpression[4])(pexpOp2,&(this->super_GdlExpression).super_GdlObject);
  }
  return;
}

Assistant:

GdlBinaryExpression(Symbol psymOperator, GdlExpression * pexpOp1, GdlExpression * pexpOp2)
		:	GdlExpression(),
			m_psymOperator(psymOperator),
			m_pexpOperand1(pexpOp1),
			m_pexpOperand2(pexpOp2)
	{
		if (m_pexpOperand1 && m_pexpOperand1->LineIsZero())
			m_pexpOperand1->PropagateLineAndFile(m_lnf);
		if (m_pexpOperand2 && m_pexpOperand2->LineIsZero())
			m_pexpOperand2->PropagateLineAndFile(m_lnf);
	}